

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidConcatNdWrongAxis(void)

{
  ulong uVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  NeuralNetwork *pNVar7;
  NeuralNetworkLayer *this;
  Tensor *pTVar8;
  ConcatNDLayerParams *pCVar9;
  ostream *poVar10;
  string *psVar11;
  long lVar12;
  undefined8 *puVar13;
  int iVar14;
  char *pcVar15;
  Result res;
  Model m;
  
  CoreML::Specification::Model::Model(&m);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"input",puVar13);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,2);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"output",puVar13);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,1);
  pNVar7 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m);
  pNVar7->arrayinputshapemapping_ = 1;
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar7->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input1");
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input2");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"output");
  pTVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Add
                     (&this->inputtensor_);
  pTVar8->rank_ = 3;
  pTVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Add
                     (&this->inputtensor_);
  pTVar8->rank_ = 3;
  pCVar9 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_concatnd(this);
  pCVar9->axis_ = -4;
  CoreML::validate<(MLModelType)500>(&res,&m);
  bVar2 = CoreML::Result::good(&res);
  if (bVar2) {
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x13f5);
    poVar10 = std::operator<<(poVar10,": error: ");
    pcVar15 = "!((res).good())";
  }
  else {
    psVar11 = CoreML::Result::message_abi_cxx11_(&res);
    iVar14 = 0;
    lVar12 = std::__cxx11::string::find((char *)psVar11,0x2e2dc0);
    if (lVar12 != -1) goto LAB_00158cf6;
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x13f6);
    poVar10 = std::operator<<(poVar10,": error: ");
    pcVar15 = "res.message().find(\"axis\") != std::string::npos";
  }
  poVar10 = std::operator<<(poVar10,pcVar15);
  poVar10 = std::operator<<(poVar10," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar10);
  iVar14 = 1;
LAB_00158cf6:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m);
  return iVar14;
}

Assistant:

int testInvalidConcatNdWrongAxis() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(1);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input1");
    layers->add_input("input2");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_concatnd();
    params->set_axis(-4);

    // axis should be in range [-rank, rank)
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    return 0;

}